

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Threads.h
# Opt level: O2

size_t __thiscall
xmrig::Threads<xmrig::CudaThreads>::move
          (Threads<xmrig::CudaThreads> *this,char *profile,CudaThreads *threads)

{
  pointer pCVar1;
  pointer pCVar2;
  bool bVar3;
  size_t sVar4;
  char *local_50;
  pair<const_xmrig::String,_xmrig::CudaThreads> local_48;
  
  local_50 = profile;
  bVar3 = has(this);
  if (bVar3) {
    sVar4 = 0;
  }
  else {
    pCVar1 = (threads->m_data).
             super__Vector_base<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pCVar2 = (threads->m_data).
             super__Vector_base<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar4 = (long)pCVar1 - (long)pCVar2 >> 5;
    if (pCVar1 != pCVar2) {
      std::pair<const_xmrig::String,_xmrig::CudaThreads>::
      pair<const_char_*&,_xmrig::CudaThreads,_true>(&local_48,&local_50,threads);
      std::
      _Rb_tree<xmrig::String,std::pair<xmrig::String_const,xmrig::CudaThreads>,std::_Select1st<std::pair<xmrig::String_const,xmrig::CudaThreads>>,std::less<xmrig::String>,std::allocator<std::pair<xmrig::String_const,xmrig::CudaThreads>>>
      ::_M_insert_unique<std::pair<xmrig::String_const,xmrig::CudaThreads>>
                ((_Rb_tree<xmrig::String,std::pair<xmrig::String_const,xmrig::CudaThreads>,std::_Select1st<std::pair<xmrig::String_const,xmrig::CudaThreads>>,std::less<xmrig::String>,std::allocator<std::pair<xmrig::String_const,xmrig::CudaThreads>>>
                  *)this,&local_48);
      std::pair<const_xmrig::String,_xmrig::CudaThreads>::~pair(&local_48);
    }
  }
  return sVar4;
}

Assistant:

inline size_t move(const char *profile, T &&threads)
    {
        if (has()) {
            return 0;
        }

        const size_t count = threads.count();

        if (!threads.isEmpty()) {
            m_profiles.insert({ profile, std::move(threads) });
        }

        return count;
    }